

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::showSystemMenu(QMdiSubWindow *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QWidget *pQVar4;
  QMenu *pQVar5;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QWidget *icon;
  QMdiSubWindowPrivate *d;
  QPoint globalPopupPos;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QWidget *in_stack_ffffffffffffff38;
  QWidget *pos;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QWidget *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QMdiSubWindow *)0x6339b0);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x6339c6);
  if (bVar2) {
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    pQVar4 = maximizedSystemMenuIconWidget((QMdiSubWindow *)in_stack_ffffffffffffff38);
    if (pQVar4 == (QWidget *)0x0) {
      bVar2 = QWidget::isLeftToRight((QWidget *)0x633af9);
      if (bVar2) {
        QWidget::contentsRect(in_stack_ffffffffffffff38);
        QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        QWidget::mapToGlobal
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (QPoint *)in_stack_ffffffffffffff38);
        pos = in_stack_ffffffffffffff48;
      }
      else {
        QWidget::contentsRect(in_stack_ffffffffffffff38);
        QRect::topRight((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        QWidget::mapToGlobal
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (QPoint *)in_stack_ffffffffffffff38);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
        ::operator+((QPoint *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    (QPoint *)in_stack_ffffffffffffff38);
        pos = in_stack_ffffffffffffff48;
      }
    }
    else {
      pos = pQVar4;
      bVar2 = QWidget::isLeftToRight((QWidget *)0x633a10);
      pQVar4 = pos;
      if (bVar2) {
        iVar3 = QWidget::y((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
        ;
        QWidget::height((QWidget *)0x633a38);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
        QWidget::mapToGlobal
                  ((QWidget *)CONCAT44(iVar3,in_stack_ffffffffffffff40),
                   (QPoint *)in_stack_ffffffffffffff38);
      }
      else {
        in_stack_ffffffffffffff34 = QWidget::width((QWidget *)0x633a8d);
        in_stack_ffffffffffffff30 =
             QWidget::y((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        QWidget::height((QWidget *)0x633aa9);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
        QWidget::mapToGlobal
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (QPoint *)pos);
        pos = in_stack_ffffffffffffff48;
      }
    }
    bVar2 = QWidget::isRightToLeft((QWidget *)0x633bd5);
    if (bVar2) {
      pQVar5 = QPointer<QMenu>::operator->((QPointer<QMenu> *)0x633bec);
      (**(code **)(*(long *)&pQVar5->super_QWidget + 0x70))();
      QSize::width((QSize *)0x633c04);
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      QPoint::operator-=((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (QPoint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    QPointer<QMenu>::operator->((QPointer<QMenu> *)0x633c35);
    QMenu::popup((QMenu *)pQVar4,in_RDI,(QAction *)pos);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::showSystemMenu()
{
    Q_D(QMdiSubWindow);
    if (!d->systemMenu)
        return;

    QPoint globalPopupPos;
    if (QWidget *icon = maximizedSystemMenuIconWidget()) {
        if (isLeftToRight())
            globalPopupPos = icon->mapToGlobal(QPoint(0, icon->y() + icon->height()));
        else
            globalPopupPos = icon->mapToGlobal(QPoint(icon->width(), icon->y() + icon->height()));
    } else {
        if (isLeftToRight())
            globalPopupPos = mapToGlobal(contentsRect().topLeft());
        else // + QPoint(1, 0) because topRight() == QPoint(left() + width() -1, top())
            globalPopupPos = mapToGlobal(contentsRect().topRight()) + QPoint(1, 0);
    }

    // Adjust x() with -menuwidth in reverse mode.
    if (isRightToLeft())
        globalPopupPos -= QPoint(d->systemMenu->sizeHint().width(), 0);
    d->systemMenu->popup(globalPopupPos);
}